

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O3

int __thiscall Node::IsNumber(Node *this)

{
  int iVar1;
  VariableStruct *pVVar2;
  uint uVar3;
  
  while (iVar1 = this->Type, iVar1 < 0x3c) {
    switch(iVar1) {
    case 0x2a:
    case 0x2d:
    case 0x2f:
      goto LAB_0010a9df;
    case 0x2b:
      this = this->Tree[0];
      break;
    default:
      goto LAB_0010a9df;
    }
  }
  uVar3 = iVar1 - 0x1c7;
  if (uVar3 < 0x2b) {
    if ((0x6f7f8000381U >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
      return 1;
    }
    if ((0x1040UL >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
      pVVar2 = VariableList::Lookup(Variables,&this->TextValue,this->Tree[0],0);
      if (pVVar2 == (VariableStruct *)0x0) {
        return 0;
      }
      if (9 < pVVar2->Type - VARTYPE_BYTE) {
        return 0;
      }
      return 1;
    }
  }
  if (((iVar1 - 0x3cU < 0x23) && ((0x400000005U >> ((ulong)(iVar1 - 0x3cU) & 0x3f) & 1) != 0)) ||
     (iVar1 == 0x165)) {
LAB_0010a9df:
    return 1;
  }
LAB_0010a9df:
  return 0;
}

Assistant:

int Node::IsNumber(void)
{
	VariableStruct *ThisVar;

	//
	// Try to figure out the variable type
	//
	switch (Type)
	{
	case BAS_V_FUNCTION:
	case BAS_V_NAME:
		//
		// Look for variable in table
		//
		ThisVar = Variables->Lookup(TextValue, Tree[0]);

		//
		// Print this variable
		//
		if (ThisVar != 0)
		{
			switch (ThisVar->Type)
			{
			case VARTYPE_BYTE:
			case VARTYPE_WORD:
			case VARTYPE_INTEGER:
			case VARTYPE_LONG:
			case VARTYPE_SINGLE:
			case VARTYPE_REAL:
			case VARTYPE_DOUBLE:
			case VARTYPE_HFLOAT:
			case VARTYPE_GFLOAT:
			case VARTYPE_DECIMAL:
				return 1;

			}
		}
		return 0;

	//
	// Sometomes used for strings.
	//
	case '+':
		return Tree[0]->IsNumber();

	//
	// Always Numeric
	//
	case '-':
	case '*':
	case '/':
	case '>':
	case '<':
	case BAS_S_MOD:
	case '^':
	case BAS_X_LAND:
	case BAS_S_EQV:
	case BAS_S_IMP:
	case BAS_X_GE:
	case BAS_X_LE:
	case BAS_P_NAME:
	case BAS_X_EQ:
	case BAS_X_NEQ:
	case BAS_S_NOT:
	case BAS_X_LNOT:
	case BAS_X_LOR:
	case BAS_S_OR:
	case BAS_N_UMINUS:
	case BAS_N_UPLUS:
	case BAS_S_XOR:
		return 1;

	// Easily a number
	//
	case BAS_V_INT:
	case BAS_V_INTEGER:
	case BAS_V_FLOAT:
		return(1);

	//
	// I don't know
	//
	default:
		return(0);
	}
}